

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_decomposer.hpp
# Opt level: O3

void __thiscall
Catch::UnaryExpr<slang::logic_t_&>::streamReconstructedExpression
          (UnaryExpr<slang::logic_t_&> *this,ostream *os)

{
  enable_if_t<_::Catch::Detail::IsStreamInsertable<logic_t>::value,_std::string> local_30;
  
  StringMaker<slang::logic_t,_void>::convert<slang::logic_t>(&local_30,this->m_lhs);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,local_30._M_dataplus._M_p,local_30._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            os << Catch::Detail::stringify( m_lhs );
        }